

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 = 0x85b498;
  (this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x85b4e8;
  *(undefined8 *)
   &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x40 = 0x85b4c0;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x78;
  puVar1 = &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.field_0x88;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  pvVar3 = *(void **)((long)&this[-1].super_IfcAnnotationSymbolOccurrence.
                             super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2 + 8)
  ;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this[-1].super_IfcAnnotationSymbolOccurrence.
                                     super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 -
                           (long)pvVar3);
  }
  operator_delete(&this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
                   super_IfcStyledItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20,0xc0);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}